

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5d835d::BracedRangeExpr::printLeft(BracedRangeExpr *this,OutputStream *S)

{
  size_t sVar1;
  char *pcVar2;
  Node *pNVar3;
  
  OutputStream::grow(S,1);
  sVar1 = S->CurrentPosition;
  S->CurrentPosition = sVar1 + 1;
  S->Buffer[sVar1] = '[';
  pNVar3 = this->First;
  (*pNVar3->_vptr_Node[4])(pNVar3,S);
  if (pNVar3->RHSComponentCache != No) {
    (*pNVar3->_vptr_Node[5])(pNVar3,S);
  }
  OutputStream::grow(S,5);
  builtin_strncpy(S->Buffer + S->CurrentPosition," ... ",5);
  S->CurrentPosition = S->CurrentPosition + 5;
  pNVar3 = this->Last;
  (*pNVar3->_vptr_Node[4])(pNVar3,S);
  if (pNVar3->RHSComponentCache != No) {
    (*pNVar3->_vptr_Node[5])(pNVar3,S);
  }
  OutputStream::grow(S,1);
  sVar1 = S->CurrentPosition;
  S->CurrentPosition = sVar1 + 1;
  S->Buffer[sVar1] = ']';
  pNVar3 = this->Init;
  if ((pNVar3->K & ~KDotSuffix) != KBracedExpr) {
    OutputStream::grow(S,3);
    pcVar2 = S->Buffer;
    sVar1 = S->CurrentPosition;
    pcVar2[sVar1 + 2] = ' ';
    pcVar2 = pcVar2 + sVar1;
    pcVar2[0] = ' ';
    pcVar2[1] = '=';
    S->CurrentPosition = S->CurrentPosition + 3;
    pNVar3 = this->Init;
  }
  (*pNVar3->_vptr_Node[4])(pNVar3,S);
  if (pNVar3->RHSComponentCache == No) {
    return;
  }
  (*pNVar3->_vptr_Node[5])(pNVar3,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += '[';
    First->print(S);
    S += " ... ";
    Last->print(S);
    S += ']';
    if (Init->getKind() != KBracedExpr && Init->getKind() != KBracedRangeExpr)
      S += " = ";
    Init->print(S);
  }